

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinput.c
# Opt level: O0

int xcb_input_input_state_data_unpack
              (void *_buffer,uint8_t class_id,xcb_input_input_state_data_t *_aux)

{
  uint xcb_padding_offset;
  uint xcb_align_to;
  uint xcb_pad;
  uint xcb_block_len;
  uint xcb_buffer_len;
  char *xcb_tmp;
  xcb_input_input_state_data_t *_aux_local;
  uint8_t class_id_local;
  void *_buffer_local;
  
  xcb_buffer_len = 0;
  xcb_block_len = 0;
  xcb_padding_offset = 2;
  xcb_tmp = (char *)_buffer;
  if (class_id == '\0') {
    (_aux->key).num_keys = *_buffer;
    (_aux->key).pad0 = *(uint8_t *)((long)_buffer + 1);
    *(undefined8 *)(_aux->key).keys = *(undefined8 *)((long)_buffer + 2);
    *(undefined8 *)((_aux->key).keys + 8) = *(undefined8 *)((long)_buffer + 10);
    *(undefined8 *)((_aux->key).keys + 0x10) = *(undefined8 *)((long)_buffer + 0x12);
    *(undefined8 *)((_aux->key).keys + 0x18) = *(undefined8 *)((long)_buffer + 0x1a);
    xcb_block_len = 0x22;
    xcb_tmp = (char *)((long)_buffer + 0x22);
  }
  xcb_align_to = (uint)(class_id == '\0');
  if (class_id == '\x01') {
    (_aux->button).num_buttons = *xcb_tmp;
    (_aux->button).pad1 = xcb_tmp[1];
    *(undefined8 *)(_aux->button).buttons = *(undefined8 *)(xcb_tmp + 2);
    *(undefined8 *)((_aux->button).buttons + 8) = *(undefined8 *)(xcb_tmp + 10);
    *(undefined8 *)((_aux->button).buttons + 0x10) = *(undefined8 *)(xcb_tmp + 0x12);
    *(undefined8 *)((_aux->button).buttons + 0x18) = *(undefined8 *)(xcb_tmp + 0x1a);
    xcb_block_len = xcb_block_len + 0x22;
    xcb_tmp = xcb_tmp + 0x22;
    xcb_align_to = 1;
  }
  if (class_id == '\x02') {
    (_aux->valuator).num_valuators = *xcb_tmp;
    (_aux->valuator).mode = xcb_tmp[1];
    xcb_buffer_len = xcb_block_len + 2;
    xcb_padding_offset = 0;
    (_aux->valuator).valuators = (int32_t *)(xcb_tmp + 2);
    xcb_block_len = (uint)(_aux->valuator).num_valuators * 4;
    xcb_align_to = 4;
  }
  return xcb_block_len + (-(xcb_block_len + xcb_padding_offset) & xcb_align_to - 1) + xcb_buffer_len
  ;
}

Assistant:

int
xcb_input_input_state_data_unpack (const void                    *_buffer,
                                   uint8_t                        class_id,
                                   xcb_input_input_state_data_t  *_aux)
{
    char *xcb_tmp = (char *)_buffer;
    unsigned int xcb_buffer_len = 0;
    unsigned int xcb_block_len = 0;
    unsigned int xcb_pad = 0;
    unsigned int xcb_align_to = 0;
    unsigned int xcb_padding_offset = 2;


    if(class_id == XCB_INPUT_INPUT_CLASS_KEY) {
        /* xcb_input_input_state_data_t.key.num_keys */
        _aux->key.num_keys = *(uint8_t *)xcb_tmp;
        xcb_block_len += sizeof(uint8_t);
        xcb_tmp += sizeof(uint8_t);
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_input_state_data_t.key.pad0 */
        _aux->key.pad0 = *(uint8_t *)xcb_tmp;
        xcb_block_len += sizeof(uint8_t);
        xcb_tmp += sizeof(uint8_t);
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_input_state_data_t.key.keys */
        memcpy(_aux->key.keys, xcb_tmp, sizeof(uint8_t) * 32);
        xcb_block_len += sizeof(uint8_t) * 32;
        xcb_tmp += sizeof(uint8_t) * 32;
        xcb_align_to = ALIGNOF(uint8_t);
    }
    if(class_id == XCB_INPUT_INPUT_CLASS_BUTTON) {
        /* xcb_input_input_state_data_t.button.num_buttons */
        _aux->button.num_buttons = *(uint8_t *)xcb_tmp;
        xcb_block_len += sizeof(uint8_t);
        xcb_tmp += sizeof(uint8_t);
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_input_state_data_t.button.pad1 */
        _aux->button.pad1 = *(uint8_t *)xcb_tmp;
        xcb_block_len += sizeof(uint8_t);
        xcb_tmp += sizeof(uint8_t);
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_input_state_data_t.button.buttons */
        memcpy(_aux->button.buttons, xcb_tmp, sizeof(uint8_t) * 32);
        xcb_block_len += sizeof(uint8_t) * 32;
        xcb_tmp += sizeof(uint8_t) * 32;
        xcb_align_to = ALIGNOF(uint8_t);
    }
    if(class_id == XCB_INPUT_INPUT_CLASS_VALUATOR) {
        /* xcb_input_input_state_data_t.valuator.num_valuators */
        _aux->valuator.num_valuators = *(uint8_t *)xcb_tmp;
        xcb_block_len += sizeof(uint8_t);
        xcb_tmp += sizeof(uint8_t);
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_input_state_data_t.valuator.mode */
        _aux->valuator.mode = *(uint8_t *)xcb_tmp;
        xcb_block_len += sizeof(uint8_t);
        xcb_tmp += sizeof(uint8_t);
        xcb_align_to = ALIGNOF(uint8_t);
        /* insert padding */
        xcb_pad = -(xcb_block_len + xcb_padding_offset) & (xcb_align_to - 1);
        xcb_buffer_len += xcb_block_len + xcb_pad;
        if (0 != xcb_pad) {
            xcb_tmp += xcb_pad;
            xcb_pad = 0;
        }
        xcb_block_len = 0;
        xcb_padding_offset = 0;
        /* valuators */
        _aux->valuator.valuators = (int32_t *)xcb_tmp;
        xcb_block_len += _aux->valuator.num_valuators * sizeof(int32_t);
        xcb_tmp += xcb_block_len;
        xcb_align_to = ALIGNOF(int32_t);
    }
    /* insert padding */
    xcb_pad = -(xcb_block_len + xcb_padding_offset) & (xcb_align_to - 1);
    xcb_buffer_len += xcb_block_len + xcb_pad;
    if (0 != xcb_pad) {
        xcb_tmp += xcb_pad;
        xcb_pad = 0;
    }
    xcb_block_len = 0;
    xcb_padding_offset = 0;

    return xcb_buffer_len;
}